

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderCommonFunctionTests.cpp
# Opt level: O0

void vkt::shaderexecutor::anon_unknown_0::
     addFunctionCases<vkt::shaderexecutor::(anonymous_namespace)::FrexpCase>
               (TestCaseGroup *parent,char *functionName,bool floatTypes,bool intTypes,
               bool uintTypes,deUint32 shaderBits)

{
  DataType DVar1;
  TestNode *node;
  TestContext *pTVar2;
  TestNode *node_00;
  ShaderType local_54;
  Precision local_50;
  int shaderTypeNdx;
  int prec;
  int vecSize;
  DataType scalarType;
  int scalarTypeNdx;
  DataType scalarTypes [3];
  TestCaseGroup *group;
  deUint32 shaderBits_local;
  bool uintTypes_local;
  bool intTypes_local;
  bool floatTypes_local;
  char *functionName_local;
  TestCaseGroup *parent_local;
  
  node = (TestNode *)operator_new(0x70);
  pTVar2 = tcu::TestNode::getTestContext(&parent->super_TestNode);
  tcu::TestCaseGroup::TestCaseGroup((TestCaseGroup *)node,pTVar2,functionName,functionName);
  tcu::TestNode::addChild(&parent->super_TestNode,node);
  _scalarType = 0x1b00000001;
  scalarTypes[0] = TYPE_UINT;
  for (vecSize = 0; vecSize < 3; vecSize = vecSize + 1) {
    DVar1 = (&scalarType)[vecSize];
    if ((((floatTypes) || (DVar1 != TYPE_FLOAT)) && ((intTypes || (DVar1 != TYPE_INT)))) &&
       ((uintTypes || (DVar1 != TYPE_UINT)))) {
      for (shaderTypeNdx = 1; shaderTypeNdx < 5; shaderTypeNdx = shaderTypeNdx + 1) {
        for (local_50 = PRECISION_MEDIUMP; (int)local_50 < 3;
            local_50 = local_50 + PRECISION_MEDIUMP) {
          for (local_54 = SHADERTYPE_VERTEX; (int)local_54 < 6;
              local_54 = local_54 + SHADERTYPE_FRAGMENT) {
            if ((shaderBits & 1 << ((byte)local_54 & 0x1f)) != 0) {
              node_00 = (TestNode *)operator_new(0xf0);
              pTVar2 = tcu::TestNode::getTestContext(&parent->super_TestNode);
              FrexpCase::FrexpCase
                        ((FrexpCase *)node_00,pTVar2,(DVar1 - TYPE_FLOAT) + shaderTypeNdx,local_50,
                         local_54);
              tcu::TestNode::addChild(node,node_00);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void addFunctionCases (tcu::TestCaseGroup* parent, const char* functionName, bool floatTypes, bool intTypes, bool uintTypes, deUint32 shaderBits)
{
	tcu::TestCaseGroup* group = new tcu::TestCaseGroup(parent->getTestContext(), functionName, functionName);
	parent->addChild(group);

	const glu::DataType scalarTypes[] =
	{
		glu::TYPE_FLOAT,
		glu::TYPE_INT,
		glu::TYPE_UINT
	};

	for (int scalarTypeNdx = 0; scalarTypeNdx < DE_LENGTH_OF_ARRAY(scalarTypes); scalarTypeNdx++)
	{
		const glu::DataType scalarType = scalarTypes[scalarTypeNdx];

		if ((!floatTypes && scalarType == glu::TYPE_FLOAT)	||
			(!intTypes && scalarType == glu::TYPE_INT)		||
			(!uintTypes && scalarType == glu::TYPE_UINT))
			continue;

		for (int vecSize = 1; vecSize <= 4; vecSize++)
		{
			for (int prec = glu::PRECISION_MEDIUMP; prec <= glu::PRECISION_HIGHP; prec++)
			{
				for (int shaderTypeNdx = 0; shaderTypeNdx < glu::SHADERTYPE_LAST; shaderTypeNdx++)
				{
					if (shaderBits & (1<<shaderTypeNdx))
						group->addChild(new TestClass(parent->getTestContext(), glu::DataType(scalarType + vecSize - 1), glu::Precision(prec), glu::ShaderType(shaderTypeNdx)));
				}
			}
		}
	}
}